

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O0

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this,size_t position)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  size_t sVar5;
  size_t position_local;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this_local;
  
  if ((this->super_ContinuousPageStack<1UL>).nextTop < position) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x20e,"(position <= this->nextTop)","position <= this->nextTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (position != (this->super_ContinuousPageStack<1UL>).nextTop) {
    if ((this->super_ContinuousPageStack<1UL>).nextTop < position + 8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0x211,"(position + sizeof(VariableElement) <= this->nextTop)",
                         "position + sizeof(VariableElement) <= this->nextTop");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pcVar4 = ContinuousPageStack<1UL>::Buffer(&this->super_ContinuousPageStack<1UL>);
    sVar5 = VariableElement::PreviousElementSize((VariableElement *)(pcVar4 + position));
    this->topElementSize = sVar5;
  }
  ContinuousPageStack<1UL>::PopTo(&this->super_ContinuousPageStack<1UL>,position);
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::PopTo(const size_t position)
{
    Assert(position <= this->nextTop);
    if(position != this->nextTop)
    {
        Assert(position + sizeof(VariableElement) <= this->nextTop);
        topElementSize = reinterpret_cast<VariableElement *>(&this->Buffer()[position])->PreviousElementSize();
    }
    ContinuousPageStack<InitialPageCount>::PopTo(position);
}